

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientKeepAlive.cpp
# Opt level: O0

void __thiscall
ki::protocol::control::ClientKeepAlive::read_from(ClientKeepAlive *this,istream *istream)

{
  unsigned_short uVar1;
  Field<unsigned_short> *pFVar2;
  ostringstream oss;
  parse_error *e;
  string local_100 [32];
  Field<unsigned_short> *local_e0;
  Field<unsigned_short> *minutes;
  string local_d0 [32];
  Field<unsigned_short> *local_b0;
  Field<unsigned_short> *milliseconds;
  allocator local_91;
  string local_90 [32];
  Field<unsigned_short> *local_70;
  Field<unsigned_short> *session_id;
  Record record;
  istream *istream_local;
  ClientKeepAlive *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)istream;
  ki::dml::Record::Record((Record *)&session_id);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"m_session_id",&local_91);
  pFVar2 = ki::dml::Record::add_field<unsigned_short>((Record *)&session_id,(string *)local_90,true)
  ;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_70 = pFVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"m_milliseconds",(allocator *)((long)&minutes + 7));
  pFVar2 = ki::dml::Record::add_field<unsigned_short>((Record *)&session_id,(string *)local_d0,true)
  ;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&minutes + 7));
  local_b0 = pFVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"m_minutes",(allocator *)((long)&e + 7));
  pFVar2 = ki::dml::Record::add_field<unsigned_short>
                     ((Record *)&session_id,(string *)local_100,true);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  local_e0 = pFVar2;
  ki::dml::Record::read_from
            ((Record *)&session_id,
             (istream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar1 = ki::dml::Field<unsigned_short>::get_value(local_70);
  this->m_session_id = uVar1;
  uVar1 = ki::dml::Field<unsigned_short>::get_value(local_b0);
  this->m_milliseconds = uVar1;
  uVar1 = ki::dml::Field<unsigned_short>::get_value(local_e0);
  this->m_minutes = uVar1;
  ki::dml::Record::~Record((Record *)&session_id);
  return;
}

Assistant:

void ClientKeepAlive::read_from(std::istream &istream)
	{
		dml::Record record;
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		auto *milliseconds = record.add_field<dml::USHRT>("m_milliseconds");
		auto *minutes = record.add_field<dml::USHRT>("m_minutes");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading ClientKeepAlive payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_session_id = session_id->get_value();
		m_milliseconds = milliseconds->get_value();
		m_minutes = minutes->get_value();
	}